

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageAndMetadata *
pbrt::Image::Read(ImageAndMetadata *__return_storage_ptr__,string *name,Allocator alloc,
                 ColorEncodingHandle *encoding)

{
  ImageMetadata *pIVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  PixelFormat PVar4;
  int iVar5;
  optional<int> *poVar6;
  optional<float> *poVar7;
  Point2i resolution;
  Point2i resolution_00;
  Point2i resolution_01;
  Point2i resolution_02;
  Point2i resolution_03;
  Point2i resolution_04;
  Point2i resolution_05;
  Point2f w;
  pointer pbVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  int i;
  int iVar12;
  uint uVar13;
  PixelFormat PVar14;
  undefined7 extraout_var;
  undefined8 *puVar15;
  Header *pHVar16;
  TypedAttribute<float> *pTVar17;
  TypedAttribute<Imath_2_5::Matrix44<float>_> *pTVar18;
  long lVar19;
  Allocator AVar20;
  ulong *puVar21;
  TypedAttribute<int> *pTVar22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  char *pcVar25;
  mapped_type *this;
  TypedAttribute<Imf_2_5::Chromaticities> *pTVar26;
  FILE *__stream;
  float *first;
  void *pvVar27;
  stbi_uc *first_00;
  pbrt *ppVar28;
  long lVar29;
  _Rb_tree_header *ptr;
  int bufferLength;
  int extraout_EDX;
  int extraout_EDX_00;
  int bufferLength_00;
  int bufferLength_01;
  Matrix44<float> *pMVar30;
  Point2i resolution_06;
  Point2i resolution_07;
  Image *pIVar31;
  Point2i resolution_08;
  Point2i resolution_09;
  uint y;
  _Rb_tree_color _Var32;
  ulong uVar33;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int c;
  pointer pbVar34;
  allocator<char> *__a;
  uint x;
  ulong uVar35;
  pointer puVar36;
  ptrdiff_t _Num;
  size_t sVar37;
  Point2i resolution_10;
  Point2i resolution_11;
  pointer puVar38;
  Point2i resolution_12;
  Point2i resolution_13;
  Point2i resolution_14;
  Point2i resolution_15;
  undefined1 auVar39 [16];
  Float FVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_07;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_08;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_09;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_11;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_14;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_15;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  allocator<char> local_5bd;
  int width;
  int height;
  undefined4 uStack_5b4;
  Tuple2<pbrt::Point2,_float> TVar44;
  float scale;
  float fStack_5a4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffa60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  InputFile file;
  undefined4 uStack_56c;
  size_t local_568;
  Tuple2<pbrt::Point2,_float> local_550;
  Allocator local_548;
  undefined8 uStack_540;
  Float rgba [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_528 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  Image image;
  optional<const_pbrt::RGBColorSpace_*> local_358;
  _Rb_tree_node_base local_340;
  size_t local_320;
  RGBColorSpace *cs;
  float *pfStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_308 [9];
  ImageMetadata metadata;
  Tuple2<pbrt::Point2,_float> local_d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_c8;
  Tuple2<pbrt::Point2,_float> local_a8;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_a0;
  Tuple2<pbrt::Point2,_float> local_80;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_78;
  Tuple2<pbrt::Point2,_float> local_58;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_50;
  
  pIVar31 = &image;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&metadata,"exr",(allocator<char> *)pIVar31);
  bVar9 = HasExtension(name,(string *)&metadata);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(CONCAT71(extraout_var,bVar9) & 0xffffffff);
  std::__cxx11::string::~string((string *)&metadata);
  if ((char)__x == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&metadata,"png",(allocator<char> *)&image);
    bVar9 = HasExtension(name,(string *)&metadata);
    std::__cxx11::string::~string((string *)&metadata);
    if (bVar9) {
      local_550 = (Tuple2<pbrt::Point2,_float>)
                  (encoding->
                  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                  ).bits;
      ReadFileContents((string *)&file,name);
      if (local_550 == (Tuple2<pbrt::Point2,_float>)0x0) {
        local_550 = ColorEncodingHandle::sRGB;
      }
      metadata.renderTimeSeconds = (optional<float>)&PTR__LodePNGState_02eef130;
      lodepng_state_init((LodePNGState *)&metadata);
      uVar13 = lodepng_inspect((uint *)&width,(uint *)&height,(LodePNGState *)&metadata,
                               (uchar *)CONCAT44(uStack_56c,_file),local_568);
      if (uVar13 != 0) {
        image._0_8_ = lodepng_error_text(uVar13);
        ErrorExit<std::__cxx11::string_const&,char_const*>("%s: %s",name,(char **)&image);
      }
      Image((Image *)&cs,alloc);
      if ((metadata.colorSpace._8_4_ & 0xfffffffb) == 0) {
        channelNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        channelNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
        uVar13 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &channelNames,(uint *)&width,(uint *)&height,
                                 (uchar *)CONCAT44(uStack_56c,_file),local_568,LCT_GREY,
                                 (uint)(metadata.colorSpace._12_4_ == 0x10) * 8 + 8);
        if (uVar13 != 0) {
          image._0_8_ = lodepng_error_text(uVar13);
          ErrorExit<std::__cxx11::string_const&,char_const*>("%s: %s",name,(char **)&image);
        }
        if (metadata.colorSpace._12_4_ == 0x10) {
          resolution.super_Tuple2<pbrt::Point2,_int>.y = height;
          resolution.super_Tuple2<pbrt::Point2,_int>.x = width;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)rgba,"Y",(allocator<char> *)&scale);
          buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          channels.n = 1;
          channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rgba;
          Image(&image,Half,resolution,channels,(ColorEncodingHandle *)&buf,AVar20);
          operator=((Image *)&cs,&image);
          ~Image(&image);
          std::__cxx11::string::~string((string *)rgba);
          lVar19 = 0;
          pbVar34 = channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar33 = 0; uVar33 < (uint)height; uVar33 = uVar33 + 1) {
            for (uVar35 = 0; uVar35 < (uint)width; uVar35 = uVar35 + 1) {
              uVar10 = swap_bytes(*(undefined2 *)&(pbVar34->_M_dataplus)._M_p);
              FVar40 = ColorEncodingHandle::ToFloatLinear
                                 ((ColorEncodingHandle *)&local_550,(float)uVar10 / 65535.0);
              SetChannel((Image *)&cs,(Point2i)(lVar19 + uVar35),0,FVar40);
              pbVar34 = (pointer)((long)&(pbVar34->_M_dataplus)._M_p + 2);
            }
            lVar19 = lVar19 + 0x100000000;
          }
          if (pbVar34 !=
              channelNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                       ,0x4bb,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
          }
        }
        else {
          resolution_02.super_Tuple2<pbrt::Point2,_int>.y = height;
          resolution_02.super_Tuple2<pbrt::Point2,_int>.x = width;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)rgba,"Y",(allocator<char> *)&scale);
          buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_550;
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          channels_03.n = 1;
          channels_03.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rgba;
          Image(&image,U256,resolution_02,channels_03,(ColorEncodingHandle *)&buf,AVar20);
          operator=((Image *)&cs,&image);
          ~Image(&image);
          std::__cxx11::string::~string((string *)rgba);
          pbVar34 = channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 = channelNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar27 = RawPointer((Image *)&cs,(Point2i)0x0);
          sVar37 = (long)pbVar8 - (long)pbVar34;
          if (sVar37 != 0) {
            memmove(pvVar27,pbVar34,sVar37);
          }
        }
        Image(&__return_storage_ptr__->image,(Image *)&cs);
        ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
        optionalValue =
             (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              )0x0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
        *(undefined8 *)
         &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
        *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0;
        *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
        *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
        *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
        *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
        *(undefined8 *)
         &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue =
             0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
        poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
        poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        poVar6->set = false;
        *(undefined3 *)&poVar6->field_0x5 = 0;
        poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
        poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        poVar7->set = false;
        *(undefined3 *)&poVar7->field_0x5 = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
        pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
        (pIVar1->renderTimeSeconds).optionalValue =
             (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        (pIVar1->renderTimeSeconds).set = false;
        *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
        *(undefined8 *)
         &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->optionalValue
             = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
        ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
        this_00 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&channelNames;
      }
      else {
        buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar13 = lodepng::decode(&buf,(uint *)&width,(uint *)&height,
                                 (uchar *)CONCAT44(uStack_56c,_file),local_568,
                                 (uint)(metadata.colorSpace._8_4_ == 6) * 4 + LCT_RGB,
                                 (uint)(metadata.colorSpace._12_4_ == 0x10) * 8 + 8);
        if (uVar13 != 0) {
          image._0_8_ = lodepng_error_text(uVar13);
          ErrorExit<std::__cxx11::string_const&,char_const*>("%s: %s",name,(char **)&image);
        }
        local_340._M_left = &local_340;
        image.resolution.super_Tuple2<pbrt::Point2,_int>.x._0_1_ = 0;
        image.p8.nAlloc._0_1_ = 0;
        image.p32.nAlloc._4_1_ = 0;
        local_358.set = false;
        local_340._M_color = _S_red;
        local_340._M_parent = (_Base_ptr)0x0;
        local_320 = 0;
        local_340._M_right = local_340._M_left;
        pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                  (&local_358,(RGBColorSpace **)&RGBColorSpace::sRGB);
        if (metadata.colorSpace._12_4_ == 0x10) {
          if (metadata.colorSpace._8_4_ == 6) {
            resolution_01.super_Tuple2<pbrt::Point2,_int>.y = height;
            resolution_01.super_Tuple2<pbrt::Point2,_int>.x = width;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&channelNames,"R",&local_5bd);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,"G",(allocator<char> *)((long)&uStack_5b4 + 3));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_458,"B",(allocator<char> *)((long)&uStack_5b4 + 2));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_438,"A",(allocator<char> *)&stack0xfffffffffffffa67);
            scale = 0.0;
            fStack_5a4 = 0.0;
            AVar20.memoryResource = pstd::pmr::new_delete_resource();
            channels_02.n = 4;
            channels_02.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelNames;
            Image((Image *)rgba,Half,resolution_01,channels_02,(ColorEncodingHandle *)&scale,AVar20)
            ;
            operator=((Image *)&cs,(Image *)rgba);
            ~Image((Image *)rgba);
            lVar19 = 0x60;
            do {
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&channelNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19));
              lVar19 = lVar19 + -0x20;
            } while (lVar19 != -0x20);
            uVar33 = 0;
            puVar36 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            while (uVar33 < (uint)height) {
              local_548.memoryResource = (memory_resource *)uVar33;
              for (uVar35 = 0; uVar35 < (uint)width; uVar35 = uVar35 + 1) {
                if (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish <= puVar36) {
                  LogFatal<char_const(&)[20]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                             ,0x4d6,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                }
                uVar10 = swap_bytes(*(undefined2 *)puVar36);
                lVar19 = 0;
                uVar11 = swap_bytes(*(undefined2 *)(puVar36 + 2));
                rgba[1] = (float)uVar11 / 65535.0;
                rgba[0] = (float)uVar10 / 65535.0;
                uVar10 = swap_bytes(*(undefined2 *)(puVar36 + 4));
                uVar11 = swap_bytes(*(undefined2 *)(puVar36 + 6));
                rgba[3] = (float)uVar11 / 65535.0;
                rgba[2] = (float)uVar10 / 65535.0;
                for (; lVar19 != 4; lVar19 = lVar19 + 1) {
                  FVar40 = ColorEncodingHandle::ToFloatLinear
                                     ((ColorEncodingHandle *)&local_550,rgba[lVar19]);
                  rgba[lVar19] = FVar40;
                  SetChannel((Image *)&cs,(Point2i)(uVar35 + (uVar33 << 0x20)),(int)lVar19,FVar40);
                }
                puVar36 = puVar36 + 8;
              }
              uVar33 = (long)local_548.memoryResource + 1;
            }
            if (puVar36 !=
                buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              LogFatal<char_const(&)[21]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                         ,0x4e2,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
            }
          }
          else {
            resolution_04.super_Tuple2<pbrt::Point2,_int>.y = height;
            resolution_04.super_Tuple2<pbrt::Point2,_int>.x = width;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&channelNames,"R",&local_5bd);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,"G",(allocator<char> *)((long)&uStack_5b4 + 3));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_458,"B",(allocator<char> *)((long)&uStack_5b4 + 2));
            scale = 0.0;
            fStack_5a4 = 0.0;
            AVar20.memoryResource = pstd::pmr::new_delete_resource();
            channels_08.n = 3;
            channels_08.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelNames;
            Image((Image *)rgba,Half,resolution_04,channels_08,(ColorEncodingHandle *)&scale,AVar20)
            ;
            operator=((Image *)&cs,(Image *)rgba);
            ~Image((Image *)rgba);
            lVar19 = 0x40;
            do {
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&channelNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19));
              lVar19 = lVar19 + -0x20;
            } while (lVar19 != -0x20);
            uVar33 = 0;
            puVar36 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            while (uVar33 < (uint)height) {
              local_548.memoryResource = (memory_resource *)uVar33;
              for (uVar35 = 0; uVar35 < (uint)width; uVar35 = uVar35 + 1) {
                if (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish <= puVar36) {
                  LogFatal<char_const(&)[20]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                             ,0x4e8,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                }
                uVar10 = swap_bytes(*(undefined2 *)puVar36);
                lVar19 = 0;
                uVar11 = swap_bytes(*(undefined2 *)(puVar36 + 2));
                rgba[1] = (float)uVar11 / 65535.0;
                rgba[0] = (float)uVar10 / 65535.0;
                uVar10 = swap_bytes(*(undefined2 *)(puVar36 + 4));
                rgba[2] = (float)uVar10 / 65535.0;
                for (; lVar19 != 3; lVar19 = lVar19 + 1) {
                  FVar40 = ColorEncodingHandle::ToFloatLinear
                                     ((ColorEncodingHandle *)&local_550,rgba[lVar19]);
                  rgba[lVar19] = FVar40;
                  SetChannel((Image *)&cs,(Point2i)(uVar35 + (uVar33 << 0x20)),(int)lVar19,FVar40);
                }
                puVar36 = puVar36 + 6;
              }
              uVar33 = (long)local_548.memoryResource + 1;
            }
            if (puVar36 !=
                buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              LogFatal<char_const(&)[21]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                         ,0x4f3,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
            }
          }
        }
        else {
          if (metadata.colorSpace._8_4_ == 6) {
            resolution_03.super_Tuple2<pbrt::Point2,_int>.y = height;
            resolution_03.super_Tuple2<pbrt::Point2,_int>.x = width;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&channelNames,"R",&local_5bd);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,"G",(allocator<char> *)((long)&uStack_5b4 + 3));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_458,"B",(allocator<char> *)((long)&uStack_5b4 + 2));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_438,"A",(allocator<char> *)&stack0xfffffffffffffa67);
            _scale = local_550;
            AVar20.memoryResource = pstd::pmr::new_delete_resource();
            channels_07.n = 4;
            channels_07.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelNames;
            Image((Image *)rgba,U256,resolution_03,channels_07,(ColorEncodingHandle *)&scale,AVar20)
            ;
            operator=((Image *)&cs,(Image *)rgba);
            ~Image((Image *)rgba);
            lVar19 = 0x60;
            do {
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&channelNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19));
              puVar38 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              puVar36 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar19 = lVar19 + -0x20;
            } while (lVar19 != -0x20);
            pvVar27 = RawPointer((Image *)&cs,(Point2i)0x0);
          }
          else {
            resolution_05.super_Tuple2<pbrt::Point2,_int>.y = height;
            resolution_05.super_Tuple2<pbrt::Point2,_int>.x = width;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&channelNames,"R",&local_5bd);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,"G",(allocator<char> *)((long)&uStack_5b4 + 3));
            std::__cxx11::string::string<std::allocator<char>>
                      (local_458,"B",(allocator<char> *)((long)&uStack_5b4 + 2));
            _scale = local_550;
            AVar20.memoryResource = pstd::pmr::new_delete_resource();
            channels_09.n = 3;
            channels_09.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelNames;
            Image((Image *)rgba,U256,resolution_05,channels_09,(ColorEncodingHandle *)&scale,AVar20)
            ;
            operator=((Image *)&cs,(Image *)rgba);
            ~Image((Image *)rgba);
            lVar19 = 0x40;
            do {
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&channelNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19));
              puVar38 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              puVar36 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar19 = lVar19 + -0x20;
            } while (lVar19 != -0x20);
            pvVar27 = RawPointer((Image *)&cs,(Point2i)0x0);
          }
          if ((long)puVar38 - (long)puVar36 != 0) {
            memmove(pvVar27,puVar36,(long)puVar38 - (long)puVar36);
          }
        }
        Image(&__return_storage_ptr__->image,(Image *)&cs);
        ImageMetadata::ImageMetadata
                  ((ImageMetadata *)((long)__return_storage_ptr__ + 0x98),(ImageMetadata *)&image);
        ImageMetadata::~ImageMetadata((ImageMetadata *)&image);
        this_00 = &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
      ~Image((Image *)&cs);
      std::__cxx11::string::~string((string *)&file);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&metadata,"pfm",(allocator<char> *)&image);
      bVar9 = HasExtension(name,(string *)&metadata);
      std::__cxx11::string::~string((string *)&metadata);
      if (bVar9) {
        ptr = &metadata.stringVectors._M_t._M_impl.super__Rb_tree_header;
        metadata.renderTimeSeconds.set = false;
        metadata.cameraFromWorld.set = false;
        metadata.NDCFromWorld.set = false;
        metadata.pixelBounds.set = false;
        metadata.fullResolution.set = false;
        metadata.samplesPerPixel.set = false;
        metadata.MSE.set = false;
        metadata.colorSpace._8_4_ = metadata.colorSpace._8_4_ & 0xffffff00;
        metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        stack0xfffffffffffffad0 = ZEXT816(0);
        metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        rgba._0_8_ = alloc.memoryResource;
        metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &ptr->_M_header;
        metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &ptr->_M_header;
        __stream = fopen((name->_M_dataplus)._M_p,"rb");
        if (__stream == (FILE *)0x0) {
          pcVar25 = "%s: unable to open PFM file";
        }
        else {
          iVar12 = readWord((FILE *)__stream,(char *)&cs,bufferLength);
          if (iVar12 == -1) {
            pcVar25 = "%s: unable to read PFM file";
          }
          else {
            iVar12 = bcmp(&cs,"Pf",3);
            local_548.memoryResource._0_4_ = iVar12;
            if (iVar12 == 0) {
              uVar13 = 1;
              iVar12 = extraout_EDX;
            }
            else {
              iVar12 = bcmp(&cs,"PF",3);
              if (iVar12 != 0) {
                ErrorExit<std::__cxx11::string_const&,char&,char&>
                          ("%s: unable to decode PFM file type \"%c%c\"",name,(char *)&cs,
                           (char *)((long)&cs + 1));
              }
              uVar13 = 3;
              iVar12 = extraout_EDX_00;
            }
            iVar12 = readWord((FILE *)__stream,(char *)&cs,iVar12);
            if (iVar12 != -1) {
              ppVar28 = (pbrt *)strlen((char *)&cs);
              str._M_str = (char *)&file;
              str._M_len = (size_t)&cs;
              bVar9 = Atoi(ppVar28,str,(int *)ptr);
              if (!bVar9) {
                pcVar25 = "%s: unable to decode width \"%s\"";
LAB_004513f4:
                ErrorExit<std::__cxx11::string_const&,char(&)[80]>(pcVar25,name,(char (*) [80])&cs);
              }
              iVar12 = readWord((FILE *)__stream,(char *)&cs,bufferLength_00);
              if (iVar12 != -1) {
                ppVar28 = (pbrt *)strlen((char *)&cs);
                str_00._M_str = (char *)&buf;
                str_00._M_len = (size_t)&cs;
                bVar9 = Atoi(ppVar28,str_00,(int *)ptr);
                if (!bVar9) {
                  pcVar25 = "%s: unable to decode height \"%s\"";
                  goto LAB_004513f4;
                }
                iVar12 = readWord((FILE *)__stream,(char *)&cs,bufferLength_01);
                if (iVar12 != -1) {
                  ppVar28 = (pbrt *)strlen((char *)&cs);
                  str_01._M_str = (char *)&scale;
                  str_01._M_len = (size_t)&cs;
                  bVar9 = Atof(ppVar28,str_01,(float *)ptr);
                  if (!bVar9) {
                    pcVar25 = "%s: unable to decode scale \"%s\"";
                    goto LAB_004513f4;
                  }
                  uVar33 = (ulong)(_file * uVar13 *
                                  (int)buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)rgba,uVar33)
                  ;
                  iVar12 = (int)buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                  do {
                    if (iVar12 < 1) {
                      if (0.0 <= scale) {
                        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
                          uVar2 = swap_bytes(*(undefined4 *)(rgba._8_8_ + uVar35 * 4));
                          *(undefined4 *)(rgba._8_8_ + uVar35 * 4) = uVar2;
                        }
                      }
                      auVar3._8_4_ = 0x7fffffff;
                      auVar3._0_8_ = 0x7fffffff7fffffff;
                      auVar3._12_4_ = 0x7fffffff;
                      auVar39 = vandps_avx512vl(ZEXT416((uint)scale),auVar3);
                      if ((auVar39._0_4_ != 1.0) || (NAN(auVar39._0_4_))) {
                        auVar41._8_4_ = 0x7fffffff;
                        auVar41._0_8_ = 0x7fffffff7fffffff;
                        auVar41._12_4_ = 0x7fffffff;
                        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
                          auVar39 = vandps_avx(ZEXT416((uint)scale),auVar41);
                          *(float *)(rgba._8_8_ + uVar35 * 4) =
                               auVar39._0_4_ * *(float *)(rgba._8_8_ + uVar35 * 4);
                        }
                      }
                      fclose(__stream);
                      if (LOGGING_LogLevel < 1) {
                        Log<std::__cxx11::string_const&,int&,int&>
                                  (Verbose,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                                   ,0x5e1,"Read PFM image %s (%d x %d)",name,(int *)&file,
                                   (int *)&buf);
                      }
                      pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                                (&metadata.colorSpace,(RGBColorSpace **)&RGBColorSpace::sRGB);
                      if ((PixelFormat)local_548.memoryResource == 0) {
                        image.format = (PixelFormat)rgba[0];
                        image.resolution.super_Tuple2<pbrt::Point2,_int>.x = (int)rgba[1];
                        image.channelNames.alloc.memoryResource =
                             (memory_resource *)aaStack_528[0]._0_8_;
                        image.channelNames.ptr =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                        image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)rgba[2];
                        image._12_4_ = rgba[3];
                        unique0x1000562d = ZEXT816(0) << 0x20;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&channelNames,"Y",(allocator<char> *)&width);
                        resolution_11.super_Tuple2<pbrt::Point2,_int>.y =
                             (int)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        resolution_11.super_Tuple2<pbrt::Point2,_int>.x = _file;
                        pIVar31 = &image;
                        channels_06.n = 1;
                        channels_06.ptr =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &channelNames;
                        TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
                        Image(&__return_storage_ptr__->image,
                              (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pIVar31,
                              resolution_11,channels_06);
                        ImageMetadata::ImageMetadata
                                  ((ImageMetadata *)((long)__return_storage_ptr__ + 0x98),&metadata)
                        ;
                        std::__cxx11::string::~string((string *)&channelNames);
                      }
                      else {
                        channelNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)aaStack_528[0]._0_8_;
                        channelNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)rgba._8_8_;
                        channelNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)rgba._0_8_;
                        unique0x1000563d = ZEXT816(0) << 0x20;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&image,"R",(allocator<char> *)&width);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&image.channelNames.nAlloc,"G",
                                   (allocator<char> *)&height);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&image.p8.ptr,"B",&local_5bd);
                        resolution_10.super_Tuple2<pbrt::Point2,_int>.y =
                             (int)buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        resolution_10.super_Tuple2<pbrt::Point2,_int>.x = _file;
                        pIVar31 = (Image *)&channelNames;
                        channels_05.n = 3;
                        channels_05.ptr =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &image;
                        TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
                        Image(&__return_storage_ptr__->image,
                              (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pIVar31,
                              resolution_10,channels_05);
                        ImageMetadata::ImageMetadata
                                  ((ImageMetadata *)((long)__return_storage_ptr__ + 0x98),&metadata)
                        ;
                        lVar19 = 0x40;
                        do {
                          std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
                          lVar19 = lVar19 + -0x20;
                        } while (lVar19 != -0x20);
                      }
                      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pIVar31)
                      ;
                      ImageMetadata::~ImageMetadata(&metadata);
                      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)rgba);
                      return (ImageAndMetadata *)TVar44;
                    }
                    iVar12 = iVar12 + -1;
                    sVar37 = fread((void *)((long)(int)(_file * uVar13 * iVar12) * 4 + rgba._8_8_),4
                                   ,(long)(int)(_file * uVar13),__stream);
                  } while (sVar37 == (long)_file * (ulong)uVar13);
                }
              }
            }
            fclose(__stream);
            pcVar25 = "%s: premature end of file in PFM file";
          }
        }
        ErrorExit<std::__cxx11::string_const&>(pcVar25,name);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&metadata,"hdr",(allocator<char> *)&image);
      bVar9 = HasExtension(name,(string *)&metadata);
      std::__cxx11::string::~string((string *)&metadata);
      metadata.renderTimeSeconds = (optional<float>)alloc.memoryResource;
      if (bVar9) {
        first = stbi_loadf((name->_M_dataplus)._M_p,(int *)&file,(int *)&buf,(int *)&scale,0);
        if (first == (float *)0x0) {
          metadata.renderTimeSeconds = (optional<float>)stbi_failure_reason();
          ErrorExit<std::__cxx11::string_const&,char_const*>("%s: %s",name,(char **)&metadata);
        }
        pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float*>
                  ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)rgba,first,
                   first + (long)(int)scale *
                           (long)(int)buf.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start * (long)_file,
                   (polymorphic_allocator<float> *)&metadata);
        stbi_image_free(first);
        switch(scale) {
        case 1.4013e-45:
          metadata.renderTimeSeconds = (optional<float>)rgba._0_8_;
          metadata.cameraFromWorld.optionalValue._0_4_ = rgba[2];
          metadata.cameraFromWorld.optionalValue._4_4_ = rgba[3];
          metadata.cameraFromWorld.optionalValue._8_8_ = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"Y",(allocator<char> *)&cs);
          resolution_06.super_Tuple2<pbrt::Point2,_int>.y =
               (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          resolution_06.super_Tuple2<pbrt::Point2,_int>.x = _file;
          channels_01.n = 1;
          channels_01.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image(&__return_storage_ptr__->image,
                (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&metadata,resolution_06,
                channels_01);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          std::__cxx11::string::~string((string *)&image);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&metadata);
          break;
        case 2.8026e-45:
          cs = (RGBColorSpace *)rgba._0_8_;
          pfStack_310 = (float *)rgba._8_8_;
          aaStack_308[0]._M_allocated_capacity = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"Y",(allocator<char> *)&channelNames);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"A",(allocator<char> *)&width);
          resolution_08.super_Tuple2<pbrt::Point2,_int>.y =
               (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          resolution_08.super_Tuple2<pbrt::Point2,_int>.x = _file;
          channels_14.n = 2;
          channels_14.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image((Image *)&metadata,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&cs,
                resolution_08,channels_14);
          lVar19 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&channelNames,"Y",(allocator<char> *)&width);
          requestedChannels_01.n = 1;
          requestedChannels_01.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelNames;
          GetChannelDesc((ImageChannelDesc *)&image,(Image *)&metadata,requestedChannels_01);
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          SelectChannels(&__return_storage_ptr__->image,(Image *)&metadata,
                         (ImageChannelDesc *)&image,AVar20);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&image);
          std::__cxx11::string::~string((string *)&channelNames);
          ~Image((Image *)&metadata);
          break;
        case 4.2039e-45:
          image.format = (PixelFormat)rgba[0];
          image.resolution.super_Tuple2<pbrt::Point2,_int>.x = (int)rgba[1];
          image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)rgba[2];
          image._12_4_ = rgba[3];
          image.channelNames.alloc.memoryResource = (memory_resource *)aaStack_528[0]._0_8_;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&metadata,"R",(allocator<char> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x18),"G",
                     (allocator<char> *)&channelNames);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x38),"B",
                     (allocator<char> *)&width);
          resolution_12.super_Tuple2<pbrt::Point2,_int>.y =
               (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          resolution_12.super_Tuple2<pbrt::Point2,_int>.x = _file;
          channels_10.n = 3;
          channels_10.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metadata;
          TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
          Image(&__return_storage_ptr__->image,
                (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&image,resolution_12,
                channels_10);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          lVar19 = 0x40;
          __return_storage_ptr__ = (ImageAndMetadata *)TVar44;
          do {
            std::__cxx11::string::~string
                      ((string *)((long)&metadata.renderTimeSeconds.optionalValue + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&image);
          break;
        case 5.60519e-45:
          channelNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)rgba._8_8_;
          channelNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)rgba._0_8_;
          channelNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_528[0]._0_8_;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"R",(allocator<char> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"G",(allocator<char> *)&width);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.p8.ptr,"B",(allocator<char> *)&height);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.p16.ptr,"A",&local_5bd);
          resolution_15.super_Tuple2<pbrt::Point2,_int>.y =
               (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          resolution_15.super_Tuple2<pbrt::Point2,_int>.x = _file;
          channels_12.n = 4;
          channels_12.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image((Image *)&metadata,
                (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&channelNames,
                resolution_15,channels_12);
          lVar19 = 0x60;
          TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&channelNames);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"R",(allocator<char> *)&width);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"G",(allocator<char> *)&height);
          std::__cxx11::string::string<std::allocator<char>>((string *)&image.p8.ptr,"B",&local_5bd)
          ;
          requestedChannels.n = 3;
          requestedChannels.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          GetChannelDesc((ImageChannelDesc *)&cs,(Image *)&metadata,requestedChannels);
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          __return_storage_ptr__ = (ImageAndMetadata *)TVar44;
          SelectChannels((Image *)TVar44,(Image *)&metadata,(ImageChannelDesc *)&cs,AVar20);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)TVar44 + 0x158))->optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)TVar44 + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)TVar44 + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)TVar44 + 0x170))->_M_header = 0;
          *(_Base_ptr *)((long)TVar44 + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)TVar44 + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)TVar44 + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)TVar44 + 400) = 0;
          *(undefined8 *)((long)TVar44 + 0x118) = 0;
          *(undefined8 *)((long)TVar44 + 0x120) = 0;
          *(undefined8 *)&((optional<pbrt::Bounds2<int>_> *)((long)TVar44 + 0x128))->optionalValue =
               0;
          *(undefined8 *)((long)TVar44 + 0x130) = 0;
          *(undefined8 *)((long)TVar44 + 0x138) = 0;
          *(undefined8 *)((long)TVar44 + 0x140) = 0;
          poVar6 = (optional<int> *)((long)TVar44 + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)TVar44 + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)TVar44 + 0xd8) = 0;
          *(undefined8 *)((long)TVar44 + 0xe0) = 0;
          *(undefined8 *)((long)TVar44 + 0xe8) = 0;
          *(undefined8 *)((long)TVar44 + 0xf0) = 0;
          *(undefined8 *)((long)TVar44 + 0xf8) = 0;
          *(undefined8 *)((long)TVar44 + 0x100) = 0;
          *(undefined8 *)((long)TVar44 + 0x108) = 0;
          *(undefined8 *)((long)TVar44 + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)TVar44 + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)&((optional<pbrt::SquareMatrix<4>_> *)((long)TVar44 + 0xa0))->optionalValue
               = 0;
          *(undefined8 *)((long)TVar44 + 0xa8) = 0;
          *(undefined8 *)((long)TVar44 + 0xb0) = 0;
          *(undefined8 *)((long)TVar44 + 0xb8) = 0;
          *(undefined8 *)((long)TVar44 + 0xc0) = 0;
          *(undefined8 *)((long)TVar44 + 200) = 0;
          *(undefined8 *)((long)TVar44 + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)TVar44 + 0x98));
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&cs);
          lVar19 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          ~Image((Image *)&metadata);
          break;
        default:
          ErrorExit<std::__cxx11::string_const&,int&>
                    ("%s: %d channel image unsupported.",name,(int *)&scale);
        }
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)rgba);
      }
      else {
        first_00 = stbi_load((name->_M_dataplus)._M_p,(int *)&channelNames,(int *)&file,(int *)&buf,
                             0);
        if (first_00 == (stbi_uc *)0x0) {
          ErrorExit<std::__cxx11::string_const&>
                    ("%s: no support for reading images with this extension",name);
        }
        pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>::
        vector<unsigned_char*>
                  ((vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>> *)rgba,
                   first_00,first_00 +
                            (long)(int)buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start *
                            (long)_file *
                            (long)(int)channelNames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                   (polymorphic_allocator<unsigned_char> *)&metadata);
        stbi_image_free(first_00);
        switch((int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        case 1:
          local_50.alloc.memoryResource = (memory_resource *)rgba._0_8_;
          local_50.ptr = (uchar *)rgba._8_8_;
          local_50.nAlloc = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&metadata,"Y",(allocator<char> *)&image);
          resolution_07.super_Tuple2<pbrt::Point2,_int>.y = _file;
          resolution_07.super_Tuple2<pbrt::Point2,_int>.x =
               (int)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_58 = ColorEncodingHandle::sRGB;
          channels_04.n = 1;
          channels_04.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metadata;
          Image(&__return_storage_ptr__->image,&local_50,resolution_07,channels_04,
                (ColorEncodingHandle *)&local_58);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          std::__cxx11::string::~string((string *)&metadata);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_50);
          break;
        case 2:
          local_78.alloc.memoryResource = (memory_resource *)rgba._0_8_;
          local_78.ptr = (uchar *)rgba._8_8_;
          local_78.nAlloc = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"Y",(allocator<char> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"A",(allocator<char> *)&scale);
          resolution_09.super_Tuple2<pbrt::Point2,_int>.y = _file;
          resolution_09.super_Tuple2<pbrt::Point2,_int>.x =
               (int)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_80 = ColorEncodingHandle::sRGB;
          channels_15.n = 2;
          channels_15.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image((Image *)&metadata,&local_78,resolution_09,channels_15,
                (ColorEncodingHandle *)&local_80);
          lVar19 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_78);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cs,"Y",(allocator<char> *)&scale);
          requestedChannels_02.n = 1;
          requestedChannels_02.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs;
          GetChannelDesc((ImageChannelDesc *)&image,(Image *)&metadata,requestedChannels_02);
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          SelectChannels(&__return_storage_ptr__->image,(Image *)&metadata,
                         (ImageChannelDesc *)&image,AVar20);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&image);
          std::__cxx11::string::~string((string *)&cs);
          ~Image((Image *)&metadata);
          break;
        case 3:
          local_a0.alloc.memoryResource = (memory_resource *)rgba._0_8_;
          local_a0.ptr = (uchar *)rgba._8_8_;
          local_a0.nAlloc = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&metadata,"R",(allocator<char> *)&image);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x18),"G",
                     (allocator<char> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x38),"B",
                     (allocator<char> *)&scale);
          resolution_13.super_Tuple2<pbrt::Point2,_int>.y = _file;
          resolution_13.super_Tuple2<pbrt::Point2,_int>.x =
               (int)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_a8 = ColorEncodingHandle::sRGB;
          channels_11.n = 3;
          channels_11.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metadata;
          TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
          Image(&__return_storage_ptr__->image,&local_a0,resolution_13,channels_11,
                (ColorEncodingHandle *)&local_a8);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)__return_storage_ptr__ + 0x158))->
          optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)__return_storage_ptr__ + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)__return_storage_ptr__ + 0x170))->_M_header = 0
          ;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)__return_storage_ptr__ + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)__return_storage_ptr__ + 400) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = 0;
          *(undefined8 *)
           &((optional<pbrt::Bounds2<int>_> *)((long)__return_storage_ptr__ + 0x128))->optionalValue
               = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = 0;
          poVar6 = (optional<int> *)((long)__return_storage_ptr__ + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)__return_storage_ptr__ + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xe8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xf8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x100) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x108) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)__return_storage_ptr__ + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)
           &((optional<pbrt::SquareMatrix<4>_> *)((long)__return_storage_ptr__ + 0xa0))->
            optionalValue = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xa8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xb8) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xc0) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 200) = 0;
          *(undefined8 *)((long)__return_storage_ptr__ + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98));
          lVar19 = 0x40;
          __return_storage_ptr__ = (ImageAndMetadata *)TVar44;
          do {
            std::__cxx11::string::~string
                      ((string *)((long)&metadata.renderTimeSeconds.optionalValue + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_a0);
          break;
        case 4:
          local_c8.alloc.memoryResource = (memory_resource *)rgba._0_8_;
          local_c8.ptr = (uchar *)rgba._8_8_;
          local_c8.nAlloc = aaStack_528[0]._M_allocated_capacity;
          register0x00001200 = ZEXT816(0) << 0x20;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"R",(allocator<char> *)&cs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"G",(allocator<char> *)&scale);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.p8.ptr,"B",(allocator<char> *)&width);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.p16.ptr,"A",(allocator<char> *)&height);
          resolution_14.super_Tuple2<pbrt::Point2,_int>.y = _file;
          resolution_14.super_Tuple2<pbrt::Point2,_int>.x =
               (int)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_d0 = ColorEncodingHandle::sRGB;
          channels_13.n = 4;
          channels_13.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image((Image *)&metadata,&local_c8,resolution_14,channels_13,
                (ColorEncodingHandle *)&local_d0);
          lVar19 = 0x60;
          TVar44 = (Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image,"R",(allocator<char> *)&scale);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"G",(allocator<char> *)&width);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.p8.ptr,"B",(allocator<char> *)&height);
          requestedChannels_00.n = 3;
          requestedChannels_00.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          GetChannelDesc((ImageChannelDesc *)&cs,(Image *)&metadata,requestedChannels_00);
          AVar20.memoryResource = pstd::pmr::new_delete_resource();
          __return_storage_ptr__ = (ImageAndMetadata *)TVar44;
          SelectChannels((Image *)TVar44,(Image *)&metadata,(ImageChannelDesc *)&cs,AVar20);
          ((optional<const_pbrt::RGBColorSpace_*> *)((long)TVar44 + 0x158))->optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          *(undefined8 *)((long)TVar44 + 0x160) = 0;
          *(undefined8 *)
           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)TVar44 + 0x168))->_M_t)._M_impl = 0;
          *(undefined8 *)&((_Rb_tree_header *)((long)TVar44 + 0x170))->_M_header = 0;
          *(_Base_ptr *)((long)TVar44 + 0x178) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)TVar44 + 0x180) = (_Base_ptr)0x0;
          *(_Base_ptr *)((long)TVar44 + 0x188) = (_Base_ptr)0x0;
          *(size_t *)((long)TVar44 + 400) = 0;
          *(undefined8 *)((long)TVar44 + 0x118) = 0;
          *(undefined8 *)((long)TVar44 + 0x120) = 0;
          *(undefined8 *)&((optional<pbrt::Bounds2<int>_> *)((long)TVar44 + 0x128))->optionalValue =
               0;
          *(undefined8 *)((long)TVar44 + 0x130) = 0;
          *(undefined8 *)((long)TVar44 + 0x138) = 0;
          *(undefined8 *)((long)TVar44 + 0x140) = 0;
          poVar6 = (optional<int> *)((long)TVar44 + 0x148);
          poVar6->optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          poVar6->set = false;
          *(undefined3 *)&poVar6->field_0x5 = 0;
          poVar7 = (optional<float> *)((long)TVar44 + 0x150);
          poVar7->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          poVar7->set = false;
          *(undefined3 *)&poVar7->field_0x5 = 0;
          *(undefined8 *)((long)TVar44 + 0xd8) = 0;
          *(undefined8 *)((long)TVar44 + 0xe0) = 0;
          *(undefined8 *)((long)TVar44 + 0xe8) = 0;
          *(undefined8 *)((long)TVar44 + 0xf0) = 0;
          *(undefined8 *)((long)TVar44 + 0xf8) = 0;
          *(undefined8 *)((long)TVar44 + 0x100) = 0;
          *(undefined8 *)((long)TVar44 + 0x108) = 0;
          *(undefined8 *)((long)TVar44 + 0x110) = 0;
          pIVar1 = (ImageMetadata *)((long)TVar44 + 0x98);
          (pIVar1->renderTimeSeconds).optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          (pIVar1->renderTimeSeconds).set = false;
          *(undefined3 *)&(pIVar1->renderTimeSeconds).field_0x5 = 0;
          *(undefined8 *)&((optional<pbrt::SquareMatrix<4>_> *)((long)TVar44 + 0xa0))->optionalValue
               = 0;
          *(undefined8 *)((long)TVar44 + 0xa8) = 0;
          *(undefined8 *)((long)TVar44 + 0xb0) = 0;
          *(undefined8 *)((long)TVar44 + 0xb8) = 0;
          *(undefined8 *)((long)TVar44 + 0xc0) = 0;
          *(undefined8 *)((long)TVar44 + 200) = 0;
          *(undefined8 *)((long)TVar44 + 0xd0) = 0;
          ImageMetadata::ImageMetadata((ImageMetadata *)((long)TVar44 + 0x98));
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&cs);
          lVar19 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar19));
            lVar19 = lVar19 + -0x20;
          } while (lVar19 != -0x20);
          ~Image((Image *)&metadata);
          break;
        default:
          ErrorExit<std::__cxx11::string_const&,int&>
                    ("%s: %d channel image unsupported.",name,(int *)&buf);
        }
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)rgba);
      }
    }
  }
  else {
    pcVar25 = (name->_M_dataplus)._M_p;
    iVar12 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile(&file,pcVar25,iVar12);
    Imf_2_5::InputFile::header();
    puVar15 = (undefined8 *)Imf_2_5::Header::dataWindow();
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar15;
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar15[1];
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
    metadata.renderTimeSeconds.set = false;
    metadata.cameraFromWorld.set = false;
    metadata.NDCFromWorld.set = false;
    metadata.pixelBounds.set = false;
    metadata.fullResolution.set = false;
    metadata.samplesPerPixel.set = false;
    metadata.MSE.set = false;
    metadata.colorSpace._8_4_ = metadata.colorSpace._8_4_ & 0xffffff00;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_548.memoryResource =
         (memory_resource *)
         buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uStack_540 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar17 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>
                        (pHVar16,"renderTimeSeconds");
    if (pTVar17 != (TypedAttribute<float> *)0x0) {
      pstd::optional<float>::operator=(&metadata.renderTimeSeconds,&pTVar17->_value);
    }
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar18 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar16,"worldToCamera");
    if (pTVar18 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      SquareMatrix<4>::SquareMatrix((SquareMatrix<4> *)pIVar31);
      pMVar30 = &pTVar18->_value;
      for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
        for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
          (&pIVar31->format)[lVar29] = (PixelFormat)pMVar30->x[0][lVar29];
        }
        pMVar30 = (Matrix44<float> *)(pMVar30->x + 1);
        pIVar31 = (Image *)&pIVar31->channelNames;
      }
      pstd::optional<pbrt::SquareMatrix<4>_>::operator=
                (&metadata.cameraFromWorld,(SquareMatrix<4> *)&image);
    }
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar18 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar16,"worldToNDC");
    if (pTVar18 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      pIVar31 = &image;
      SquareMatrix<4>::SquareMatrix((SquareMatrix<4> *)pIVar31);
      pMVar30 = &pTVar18->_value;
      for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
        for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
          (*(Float (*) [4])&pIVar31->format)[lVar29] = pMVar30->x[0][lVar29];
        }
        pMVar30 = (Matrix44<float> *)(pMVar30->x + 1);
        pIVar31 = (Image *)&pIVar31->channelNames;
      }
      pstd::optional<pbrt::SquareMatrix<4>_>::operator=
                (&metadata.NDCFromWorld,(SquareMatrix<4> *)&image);
    }
    PVar14 = (int)uStack_540 + Half;
    iVar12 = uStack_540._4_4_ + 1;
    PVar4 = (PixelFormat)local_548.memoryResource;
    if ((int)PVar14 < (int)(PixelFormat)local_548.memoryResource) {
      PVar4 = PVar14;
    }
    iVar5 = local_548.memoryResource._4_4_;
    if (iVar12 < local_548.memoryResource._4_4_) {
      iVar5 = iVar12;
    }
    image.resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar5;
    image.format = PVar4;
    if ((int)PVar14 < (int)(PixelFormat)local_548.memoryResource) {
      PVar14 = (PixelFormat)local_548.memoryResource;
    }
    if (iVar12 < local_548.memoryResource._4_4_) {
      iVar12 = local_548.memoryResource._4_4_;
    }
    image._12_4_ = iVar12;
    image.resolution.super_Tuple2<pbrt::Point2,_int>.y = PVar14;
    pstd::optional<pbrt::Bounds2<int>_>::operator=(&metadata.pixelBounds,(Bounds2<int> *)&image);
    Imf_2_5::InputFile::header();
    puVar21 = (ulong *)Imf_2_5::Header::displayWindow();
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *puVar21;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = puVar21[1];
    auVar3 = vpsubd_avx(auVar42,auVar39);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = puVar21[1];
    auVar39 = vpcmpeqd_avx(auVar42,auVar43);
    auVar39 = vpsubd_avx(auVar3,auVar39);
    image._0_8_ = auVar39._0_8_;
    pstd::optional<pbrt::Point2<int>_>::operator=(&metadata.fullResolution,(Point2<int> *)&image);
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar22 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>
                        (pHVar16,"samplesPerPixel");
    if (pTVar22 != (TypedAttribute<int> *)0x0) {
      pstd::optional<int>::operator=(&metadata.samplesPerPixel,&pTVar22->_value);
    }
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar17 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>(pHVar16,"MSE");
    if (pTVar17 != (TypedAttribute<float> *)0x0) {
      pstd::optional<float>::operator=(&metadata.MSE,&pTVar17->_value);
    }
    local_548.memoryResource = alloc.memoryResource;
    Imf_2_5::InputFile::header();
    p_Var23 = (_Rb_tree_node_base *)Imf_2_5::Header::begin();
    __a = (allocator<char> *)&cs;
    while( true ) {
      Imf_2_5::InputFile::header();
      p_Var24 = (_Rb_tree_node_base *)Imf_2_5::Header::end();
      if (p_Var23 == p_Var24) break;
      pcVar25 = (char *)(**(code **)(**(long **)(p_Var23 + 9) + 0x10))();
      iVar12 = strcmp(pcVar25,"stringvector");
      if (iVar12 == 0) {
        lVar19 = *(long *)(p_Var23 + 9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&image,(char *)(p_Var23 + 1),__a);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&metadata.stringVectors,(key_type *)&image);
        __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(lVar19 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(this,__x);
        std::__cxx11::string::~string((string *)&image);
      }
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    }
    pHVar16 = (Header *)Imf_2_5::InputFile::header();
    pTVar26 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>>
                        (pHVar16,"chromaticities");
    if (pTVar26 != (TypedAttribute<Imf_2_5::Chromaticities> *)0x0) {
      image._0_8_ = (pTVar26->_value).red;
      image._8_8_ = (pTVar26->_value).green;
      image.channelNames.alloc.memoryResource = *(memory_resource **)&(pTVar26->_value).blue;
      image.channelNames.ptr =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            &(pTVar26->_value).white;
      w.super_Tuple2<pbrt::Point2,_float>.y = uStack_5b4;
      w.super_Tuple2<pbrt::Point2,_float>.x = (float)height;
      cs = RGBColorSpace::Lookup
                     ((Point2f)in_stack_fffffffffffffa60,(Point2f)_scale,
                      (Point2f)__return_storage_ptr__,w);
      if (cs == (RGBColorSpace *)0x0) {
        Warning<float&,float&,float&,float&,float&,float&,float&,float&>
                  ("Couldn\'t find supported color space that matches chromaticities: r (%f, %f) g (%f, %f) b (%f, %f), w (%f, %f). Using sRGB."
                   ,(float *)&image,(float *)&image.resolution,
                   (float *)&image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                   (float *)&image.field_0xc,(float *)&image.channelNames,
                   (float *)((long)&image.channelNames.alloc.memoryResource + 4),
                   (float *)&image.channelNames.ptr,(float *)((long)&image.channelNames.ptr + 4));
        __a = (allocator<char> *)&RGBColorSpace::sRGB;
      }
      pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                (&metadata.colorSpace,(RGBColorSpace **)__a);
    }
    channelNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    channelNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    channelNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    width = ((int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start) + 1;
    height = (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ -
             buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) + 1;
    Imf_2_5::InputFile::header();
    Imf_2_5::Header::channels();
    p_Var23 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::begin();
    iVar12 = 0;
    while( true ) {
      p_Var24 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::end();
      _Var32 = (_Rb_tree_color)__x;
      if (p_Var23 == p_Var24) break;
      bVar9 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if (bVar9) {
        __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(ulong)p_Var23[9]._M_color;
      }
      else if (_Var32 != p_Var23[9]._M_color) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x42d,"ReadEXR() doesn\'t currently support images with multiple channel types.");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&image,(char *)(p_Var23 + 1),(allocator<char> *)&cs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&channelNames,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image);
      std::__cxx11::string::~string((string *)&image);
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    }
    if (1 < _Var32 - _S_black) {
      LogFatal<char_const(&)[50]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x432,"Check failed: %s",
                 (char (*) [50])"pixelType == Imf::HALF || pixelType == Imf::FLOAT");
    }
    resolution_00.super_Tuple2<pbrt::Point2,_int>.y = height;
    resolution_00.super_Tuple2<pbrt::Point2,_int>.x = width;
    _scale = (Tuple2<pbrt::Point2,_float>)0x0;
    channels_00.n =
         (long)channelNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)channelNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    channels_00.ptr =
         channelNames.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    Image(&image,(_Var32 != _S_black) + Half,resolution_00,channels_00,(ColorEncodingHandle *)&scale
          ,local_548);
    AllChannelsDesc((ImageChannelDesc *)rgba,&image);
    imageToFrameBuffer((FrameBuffer *)&cs,&image,(ImageChannelDesc *)rgba,(Box2i *)&buf);
    Imf_2_5::InputFile::setFrameBuffer((FrameBuffer *)&file);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&cs);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)rgba);
    Imf_2_5::InputFile::readPixels
              ((int)&file,
               buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_);
    if (LOGGING_LogLevel < 1) {
      Log<std::__cxx11::string_const&,int&,int&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x438,"Read EXR image %s (%d x %d)",name,&width,&height);
    }
    Image(&__return_storage_ptr__->image,&image);
    ImageMetadata::ImageMetadata((ImageMetadata *)((long)__return_storage_ptr__ + 0x98),&metadata);
    ~Image(&image);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&channelNames);
    ImageMetadata::~ImageMetadata(&metadata);
    Imf_2_5::InputFile::~InputFile(&file);
  }
  return (ImageAndMetadata *)(Tuple2<pbrt::Point2,_float>)__return_storage_ptr__;
}

Assistant:

ImageAndMetadata Image::Read(const std::string &name, Allocator alloc,
                             ColorEncodingHandle encoding) {
    if (HasExtension(name, "exr"))
        return ReadEXR(name, alloc);
    else if (HasExtension(name, "png"))
        return ReadPNG(name, alloc, encoding);
    else if (HasExtension(name, "pfm"))
        return ReadPFM(name, alloc);
    else if (HasExtension(name, "hdr"))
        return ReadHDR(name, alloc);
    else {
        int x, y, n;
        unsigned char *data = stbi_load(name.c_str(), &x, &y, &n, 0);
        if (data) {
            pstd::vector<uint8_t> pixels(data, data + x * y * n, alloc);
            stbi_image_free(data);
            switch (n) {
            case 1:
                return ImageAndMetadata{
                    Image(std::move(pixels), {x, y}, {"Y"}, ColorEncodingHandle::sRGB),
                    ImageMetadata()};
            case 2: {
                Image image(std::move(pixels), {x, y}, {"Y", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{image.SelectChannels(image.GetChannelDesc({"Y"})),
                                        ImageMetadata()};
            }
            case 3:
                return ImageAndMetadata{Image(std::move(pixels), {x, y}, {"R", "G", "B"},
                                              ColorEncodingHandle::sRGB),
                                        ImageMetadata()};
            case 4: {
                Image image(std::move(pixels), {x, y}, {"R", "G", "B", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{
                    image.SelectChannels(image.GetChannelDesc({"R", "G", "B"})),
                    ImageMetadata()};
            }
            default:
                ErrorExit("%s: %d channel image unsupported.", name, n);
            }
        } else
            ErrorExit("%s: no support for reading images with this extension", name);
    }
}